

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O1

shared_ptr<CBlock> __thiscall
validation_block_tests::MinerTestingSetup::Block(MinerTestingSetup *this,uint256 *prev_hash)

{
  uint uVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  TestingSetup *pTVar7;
  int iVar8;
  Chainstate *chainstate;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  CBlockIndex *pCVar10;
  CChainParams *pCVar11;
  uint256 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  pointer *__ptr;
  long lVar13;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar14;
  long in_FS_OFFSET;
  shared_ptr<CBlock> sVar15;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> ptemplate;
  CMutableTransaction txCoinbase;
  Options options;
  undefined1 local_168 [8];
  undefined1 local_160 [24];
  undefined1 local_148 [176];
  Options local_98;
  unique_lock<std::recursive_mutex> local_68;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (Block(uint256_const&)::time == '\0') {
    iVar8 = __cxa_guard_acquire(&Block(uint256_const&)::time);
    if (iVar8 != 0) {
      pCVar11 = Params();
      Block::time = (uint64_t)(pCVar11->genesis).super_CBlockHeader.nTime;
      __cxa_guard_release(&Block(uint256_const&)::time);
    }
  }
  local_98.super_BlockCreateOptions.use_mempool = true;
  local_98.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  local_98.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  local_98.nBlockMaxWeight = 0x3cf960;
  local_98.blockMinFeeRate.nSatoshisPerK = 1000;
  local_98.test_block_validity = true;
  local_98.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         (*(ChainstateManager **)prev_hash[3].super_base_blob<256U>.m_data._M_elems)
  ;
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)local_160,chainstate,
             *(CTxMemPool **)prev_hash[2].super_base_blob<256U>.m_data._M_elems,&local_98);
  local_58._16_8_ = 0;
  uStack_40 = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  lVar13 = (long)Block::i;
  Block::i = Block::i + 1;
  ppVar9 = &CScript::push_int64((CScript *)local_58,lVar13)->super_CScriptBase;
  uVar1 = ppVar9->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar14 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar14 = ppVar9;
  }
  local_68._M_device = (mutex_type *)CONCAT71(local_68._M_device._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar14->_union + (long)(int)uVar3),(uchar *)&local_68);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_168,(CScript *)local_160);
  if (0x1c < uStack_40._4_4_) {
    free((void *)local_58._0_8_);
    local_58._0_8_ = (char *)0x0;
  }
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_148 + 0x10));
  if ((_Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
      local_160._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_160,(CBlockTemplate *)local_160._0_8_);
  }
  pTVar7 = &(this->super_RegTestingSetup).super_TestingSetup;
  (pTVar7->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_flag =
       (__atomic_base<bool>)0x0;
  *(undefined3 *)&(pTVar7->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.field_0x1 =
       0;
  (pTVar7->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_pipe_r = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlock,std::allocator<CBlock>,CBlock&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_interrupt.m_pipe_w,(CBlock **)this,
             (allocator<CBlock> *)local_160,(CBlock *)local_168);
  lVar13 = *(long *)&(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                     super_BasicTestingSetup.m_interrupt;
  uVar4 = *(undefined8 *)(in_RDX->super_base_blob<256U>).m_data._M_elems;
  uVar5 = *(undefined8 *)((in_RDX->super_base_blob<256U>).m_data._M_elems + 8);
  uVar6 = *(undefined8 *)((in_RDX->super_base_blob<256U>).m_data._M_elems + 0x18);
  *(undefined8 *)(lVar13 + 0x14) =
       *(undefined8 *)((in_RDX->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined8 *)(lVar13 + 0x1c) = uVar6;
  *(undefined8 *)(lVar13 + 4) = uVar4;
  *(undefined8 *)(lVar13 + 0xc) = uVar5;
  Block::time = Block::time + 1;
  *(int *)(lVar13 + 0x44) = (int)Block::time;
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)local_160,(CTransaction *)**(undefined8 **)(lVar13 + 0x50));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_148,2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(((pointer)(local_148._0_8_ + 0x28))->scriptPubKey).super_CScriptBase,
             &P2WSH_OP_TRUE.super_CScriptBase);
  ((pointer)(local_148._0_8_ + 0x28))->nValue = *(CAmount *)local_148._0_8_;
  *(CAmount *)local_148._0_8_ = 0;
  CScriptWitness::SetNull((CScriptWitness *)(local_160._0_8_ + 0x50));
  local_58._16_8_ = 0;
  uStack_40 = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  local_68._M_device = &cs_main.super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  pCVar10 = ::node::BlockManager::LookupBlockIndex
                      ((BlockManager *)
                       (*(long *)prev_hash[3].super_base_blob<256U>.m_data._M_elems + 0x800),in_RDX)
  ;
  iVar8 = pCVar10->nHeight;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  ppVar9 = &CScript::push_int64((CScript *)local_58,(long)iVar8 + 1)->super_CScriptBase;
  uVar1 = ppVar9->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  ppVar14 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar14 = ppVar9;
  }
  local_68._M_device = (mutex_type *)((ulong)local_68._M_device & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar14->_union + (long)(int)uVar3),(uchar *)&local_68);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_160._0_8_ + 0x28),ppVar9);
  if (0x1c < uStack_40._4_4_) {
    free((void *)local_58._0_8_);
  }
  local_58._0_8_ = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),(CTransaction **)local_58,
             (allocator<CTransaction> *)&local_68,(CMutableTransaction *)local_160);
  uVar5 = local_58._8_8_;
  uVar4 = local_58._0_8_;
  puVar2 = *(undefined8 **)
            (*(long *)&(this->super_RegTestingSetup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_interrupt + 0x50);
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
  *puVar2 = uVar4;
  puVar2[1] = uVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_148);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_160);
  _Var12._M_pi = extraout_RDX;
  if ((_Head_base<0UL,_node::CBlockTemplate_*,_false>)local_168 !=
      (_Head_base<0UL,_node::CBlockTemplate_*,_false>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_168,(CBlockTemplate *)local_168);
    _Var12._M_pi = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    sVar15.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var12._M_pi;
    sVar15.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<CBlock>)sVar15.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CBlock> MinerTestingSetup::Block(const uint256& prev_hash)
{
    static int i = 0;
    static uint64_t time = Params().GenesisBlock().nTime;

    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(CScript{} << i++ << OP_TRUE);
    auto pblock = std::make_shared<CBlock>(ptemplate->block);
    pblock->hashPrevBlock = prev_hash;
    pblock->nTime = ++time;

    // Make the coinbase transaction with two outputs:
    // One zero-value one that has a unique pubkey to make sure that blocks at the same height can have a different hash
    // Another one that has the coinbase reward in a P2WSH with OP_TRUE as witness program to make it easy to spend
    CMutableTransaction txCoinbase(*pblock->vtx[0]);
    txCoinbase.vout.resize(2);
    txCoinbase.vout[1].scriptPubKey = P2WSH_OP_TRUE;
    txCoinbase.vout[1].nValue = txCoinbase.vout[0].nValue;
    txCoinbase.vout[0].nValue = 0;
    txCoinbase.vin[0].scriptWitness.SetNull();
    // Always pad with OP_0 at the end to avoid bad-cb-length error
    txCoinbase.vin[0].scriptSig = CScript{} << WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(prev_hash)->nHeight + 1) << OP_0;
    pblock->vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    return pblock;
}